

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroup::RowGroup(RowGroup *this,RowGroupCollection *collection_p,RowGroupPointer *pointer)

{
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true> *this_00;
  vector<duckdb::MetaBlockPointer,_true> *pvVar1;
  uint64_t uVar2;
  pointer __p;
  long lVar3;
  pointer __p_00;
  type paVar4;
  IOException *this_01;
  idx_t c;
  ulong __i;
  allocator local_69;
  vector<duckdb::MetaBlockPointer,_true> *local_68;
  vector<duckdb::MetaBlockPointer,_true> *local_60;
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true> *local_58;
  string local_50;
  
  uVar2 = pointer->tuple_count;
  (this->super_SegmentBase<duckdb::RowGroup>).start = pointer->row_start;
  (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i = uVar2;
  (this->super_SegmentBase<duckdb::RowGroup>).next._M_b._M_p = (__pointer_type)0x0;
  (this->collection)._M_data = collection_p;
  this_00 = &this->columns;
  pvVar1 = &this->column_pointers;
  local_68 = &this->deletes_pointers;
  this->allocation_size = 0;
  switchD_016d4fed::default(&this->version_info,0,0x90);
  lVar3 = (long)(collection_p->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(collection_p->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_60 = pvVar1;
  local_58 = this_00;
  if ((long)(pointer->data_pointers).
            super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
            super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pointer->data_pointers).
            super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
            super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
            _M_impl.super__Vector_impl_data._M_start >> 4 == lVar3 / 0x18) {
    ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::
    _M_move_assign(&pvVar1->
                    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                   ,&pointer->data_pointers);
    ::std::
    vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
    ::resize(&this_00->
              super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
             ,(long)(this->column_pointers).
                    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                    .
                    super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->column_pointers).
                    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                    .
                    super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
    __p_00 = (pointer)operator_new__((long)(this->columns).
                                           super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                           .
                                           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->columns).
                                           super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                           .
                                           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4);
    local_50._M_dataplus._M_p = (pointer)0x0;
    ::std::__uniq_ptr_impl<std::atomic<bool>,_std::default_delete<std::atomic<bool>[]>_>::reset
              ((__uniq_ptr_impl<std::atomic<bool>,_std::default_delete<std::atomic<bool>[]>_> *)
               &this->is_loaded,__p_00);
    ::std::unique_ptr<std::atomic<bool>[],_std::default_delete<std::atomic<bool>[]>_>::~unique_ptr
              ((unique_ptr<std::atomic<bool>[],_std::default_delete<std::atomic<bool>[]>_> *)
               &local_50);
    for (__i = 0; __i < (ulong)((long)(this->columns).
                                      super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->columns).
                                      super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4); __i = __i + 1
        ) {
      paVar4 = unique_ptr<std::atomic<bool>[],_std::default_delete<std::atomic<bool>[]>,_true>::
               operator[](&this->is_loaded,__i);
      LOCK();
      (paVar4->_M_base)._M_i = false;
      UNLOCK();
    }
    ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::
    _M_move_assign(&local_68->
                    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                   ,&pointer->deletes_pointers);
    LOCK();
    (this->deletes_is_loaded)._M_base._M_i = false;
    UNLOCK();
    return;
  }
  this_01 = (IOException *)__cxa_allocate_exception(0x10,0x18,lVar3 % 0x18);
  ::std::__cxx11::string::string
            ((string *)&local_50,
             "Row group column count is unaligned with table column count. Corrupt file?",&local_69)
  ;
  IOException::IOException(this_01,&local_50);
  __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

RowGroup::RowGroup(RowGroupCollection &collection_p, RowGroupPointer pointer)
    : SegmentBase<RowGroup>(pointer.row_start, pointer.tuple_count), collection(collection_p), version_info(nullptr),
      allocation_size(0) {
	// deserialize the columns
	if (pointer.data_pointers.size() != collection_p.GetTypes().size()) {
		throw IOException("Row group column count is unaligned with table column count. Corrupt file?");
	}
	this->column_pointers = std::move(pointer.data_pointers);
	this->columns.resize(column_pointers.size());
	this->is_loaded = unique_ptr<atomic<bool>[]>(new atomic<bool>[columns.size()]);
	for (idx_t c = 0; c < columns.size(); c++) {
		this->is_loaded[c] = false;
	}
	this->deletes_pointers = std::move(pointer.deletes_pointers);
	this->deletes_is_loaded = false;

	Verify();
}